

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

string * __thiscall
helics::ValueFederateManager::localQuery_abi_cxx11_
          (string *__return_storage_ptr__,ValueFederateManager *this,string_view queryStr)

{
  DataType DVar1;
  _func_int *p_Var2;
  pointer pcVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  _Rb_tree_node_base *p_Var10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string *psVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  int *__s1;
  long lVar12;
  ulong uVar13;
  size_t __n;
  uint __len;
  Input **ppIVar14;
  uint __val;
  pthread_rwlock_t *ppVar15;
  long *plVar16;
  unique_lock<std::mutex> *this_00;
  long *plVar17;
  ulong uVar18;
  Input *inp;
  _Rb_tree_header *p_Var19;
  Input *pIVar20;
  double val;
  JsonBuilder JB;
  json V;
  Input inpTemp;
  Input **local_1e8;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  string *local_198;
  shared_handle local_190;
  pthread_rwlock_t *local_178;
  data local_170;
  undefined1 local_160 [80];
  DataType local_110;
  
  __s1 = (int *)queryStr._M_str;
  __n = queryStr._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_198 = __return_storage_ptr__;
  switch(__n) {
  case 6:
    if ((short)__s1[1] == 0x7374 && *__s1 == 0x75706e69) {
      gmlc::libguarded::
      shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
      ::lock_shared(&local_190,&this->inputs);
      local_1b8._0_8_ = &local_1a8;
      local_1a8._M_allocated_capacity._0_2_ = 0x5b;
      local_1b8._8_8_ = (mutex_type *)0x1;
      if (((local_190.data)->dataStorage).csize == 0) {
        iVar6 = ((local_190.data)->dataStorage).bsize;
        uVar18 = (ulong)iVar6;
        local_1e8 = ((local_190.data)->dataStorage).dataptr;
        if (uVar18 == 0x20) {
          lVar12 = (long)((local_190.data)->dataStorage).dataSlotIndex;
          if (local_1e8 == (Input **)0x0) {
            ppIVar14 = (Input **)
                       &gmlc::containers::
                        StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                        emptyValue;
          }
          else {
            ppIVar14 = local_1e8 + lVar12 + 1;
          }
          pIVar20 = *ppIVar14;
          goto LAB_0020fa89;
        }
        lVar12 = (long)((local_190.data)->dataStorage).dataSlotIndex;
        pIVar20 = local_1e8[lVar12] + uVar18;
        ppIVar14 = local_1e8 + lVar12;
LAB_0020f855:
        local_1e8 = local_1e8 + lVar12;
      }
      else {
        local_1e8 = ((local_190.data)->dataStorage).dataptr;
        pIVar20 = *local_1e8;
        iVar6 = ((local_190.data)->dataStorage).bsize;
        uVar18 = 0;
        lVar12 = (long)((local_190.data)->dataStorage).dataSlotIndex;
        ppIVar14 = local_1e8;
        if (iVar6 != 0x20) goto LAB_0020f855;
LAB_0020fa89:
        if (local_1e8 == (Input **)0x0) {
          local_1e8 = (Input **)
                      &gmlc::containers::
                       StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                       emptyValue;
        }
        else {
          local_1e8 = local_1e8 + lVar12 + 1;
        }
        uVar18 = 0;
        iVar6 = 0;
      }
      if (((int)uVar18 != iVar6) || (ppIVar14 != local_1e8)) {
        do {
          psVar11 = Interface::getName_abi_cxx11_(&pIVar20->super_Interface);
          if (psVar11->_M_string_length != 0) {
            psVar11 = Interface::getName_abi_cxx11_(&pIVar20->super_Interface);
            local_1d8._0_8_ = &local_1c8;
            pcVar3 = (psVar11->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1d8,pcVar3,pcVar3 + psVar11->_M_string_length);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_170,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::dump((string_t *)local_160,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_170,-1,' ',true,hex);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_170);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8
                      ,(char *)local_160._0_8_,local_160._8_8_);
            if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
              operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._0_8_ != &local_1c8) {
              operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8
                      ,',');
          }
          iVar9 = (int)uVar18;
          uVar18 = (ulong)(iVar9 + 1U);
          if (iVar9 < 0x1f) {
            pIVar20 = pIVar20 + 1;
          }
          else {
            ppIVar14 = ppIVar14 + (ulong)(iVar9 - 0x1fU >> 5) + 1;
            uVar18 = (ulong)(iVar9 + 1U & 0x1f);
            pIVar20 = *ppIVar14 + uVar18;
          }
        } while (((int)uVar18 != iVar6) || (ppIVar14 != local_1e8));
        if ((mutex_type *)0x1 < (ulong)local_1b8._8_8_) goto LAB_00210110;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,']');
      goto LAB_0021012b;
    }
    iVar6 = bcmp(__s1,"values",__n);
    if (iVar6 != 0) {
      return local_198;
    }
    fileops::JsonBuilder::JsonBuilder((JsonBuilder *)&local_190);
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock_shared((shared_handle *)local_1b8,&this->inputs);
    if (*(size_type *)local_1b8._0_8_ == 0) {
      iVar6 = (int)*(long *)(local_1b8._0_8_ + 0x18);
      uVar18 = (ulong)iVar6;
      local_178 = *(pthread_rwlock_t **)(local_1b8._0_8_ + 8);
      if (uVar18 == 0x20) {
        if (local_178 == (pthread_rwlock_t *)0x0) {
          ppVar15 = (pthread_rwlock_t *)
                    &gmlc::containers::
                     StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                     emptyValue;
        }
        else {
          ppVar15 = (pthread_rwlock_t *)
                    (local_178->__size + (long)*(int *)(local_1b8._0_8_ + 0x14) * 8 + 8);
        }
        pIVar20 = *(Input **)ppVar15;
        goto LAB_0020fdba;
      }
      ppVar15 = (pthread_rwlock_t *)((long)local_178 + (long)*(int *)(local_1b8._0_8_ + 0x14) * 8);
      pIVar20 = (Input *)(uVar18 * 0x130 + ppVar15->__align);
LAB_0020f89a:
      local_178 = (pthread_rwlock_t *)((long)local_178 + (long)*(int *)(local_1b8._0_8_ + 0x14) * 8)
      ;
    }
    else {
      local_178 = *(pthread_rwlock_t **)(local_1b8._0_8_ + 8);
      pIVar20 = *(Input **)local_178;
      iVar6 = (int)*(long *)(local_1b8._0_8_ + 0x18);
      uVar18 = 0;
      ppVar15 = local_178;
      if (iVar6 != 0x20) goto LAB_0020f89a;
LAB_0020fdba:
      if (local_178 == (pthread_rwlock_t *)0x0) {
        local_178 = (pthread_rwlock_t *)
                    &gmlc::containers::
                     StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                     emptyValue;
      }
      else {
        local_178 = (pthread_rwlock_t *)
                    (local_178->__size + (long)*(int *)(local_1b8._0_8_ + 0x14) * 8 + 8);
      }
      uVar18 = 0;
      iVar6 = 0;
    }
    if (((int)uVar18 != iVar6) || (ppVar15 != local_178)) {
      do {
        Input::Input((Input *)local_160,pIVar20);
        Input::checkUpdate((Input *)local_160,true);
        if ((local_110 == HELICS_ANY) || (DVar1 = local_110, local_110 == HELICS_UNKNOWN)) {
          DVar1 = pIVar20->injectionType;
        }
        p_Var2 = (pIVar20->super_Interface)._vptr_Interface[4];
        if (DVar1 == HELICS_VECTOR) {
          iVar9 = (*p_Var2)(pIVar20);
          Input::getValue_impl<std::vector<double,std::allocator<double>>>
                    ((vector<double,_std::allocator<double>_> *)local_1d8,(Input *)local_160);
          fileops::JsonBuilder::addElement
                    ((JsonBuilder *)&local_190,(string *)CONCAT44(extraout_var_03,iVar9),
                     (vector<double,_std::allocator<double>_> *)local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            uVar13 = local_1c8._M_allocated_capacity - local_1d8._0_8_;
LAB_0020fee2:
            operator_delete((void *)local_1d8._0_8_,uVar13);
          }
        }
        else if (DVar1 == HELICS_DOUBLE) {
          iVar9 = (*p_Var2)(pIVar20);
          Input::getValue_impl<double>((Input *)local_160,local_1d8);
          fileops::JsonBuilder::addElement
                    ((JsonBuilder *)&local_190,(string *)CONCAT44(extraout_var_02,iVar9),
                     (double)local_1d8._0_8_);
        }
        else {
          iVar9 = (*p_Var2)(pIVar20);
          Input::getValue_impl<std::__cxx11::string>((string *)local_1d8,(Input *)local_160);
          fileops::JsonBuilder::addElement
                    ((JsonBuilder *)&local_190,(string *)CONCAT44(extraout_var_04,iVar9),
                     (string *)local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._0_8_ != &local_1c8) {
            uVar13 = local_1c8._M_allocated_capacity + 1;
            goto LAB_0020fee2;
          }
        }
        Input::~Input((Input *)local_160);
        iVar9 = (int)uVar18;
        uVar18 = (ulong)(iVar9 + 1U);
        if (iVar9 < 0x1f) {
          pIVar20 = pIVar20 + 1;
        }
        else {
          ppVar15 = (pthread_rwlock_t *)(ppVar15->__size + (ulong)(iVar9 - 0x1fU >> 5) * 8 + 8);
          uVar18 = (ulong)(iVar9 + 1U & 0x1f);
          pIVar20 = (Input *)(uVar18 * 0x130 + ppVar15->__align);
        }
      } while (((int)uVar18 != iVar6) || (ppVar15 != local_178));
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_1b8 + 8));
    fileops::JsonBuilder::generate_abi_cxx11_((string *)local_160,(JsonBuilder *)&local_190);
    break;
  case 7:
    iVar6 = bcmp(__s1,"updates",__n);
    if (iVar6 != 0) {
      return local_198;
    }
    fileops::JsonBuilder::JsonBuilder((JsonBuilder *)&local_190);
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock_shared((shared_handle *)local_1b8,&this->inputs);
    if (*(size_type *)local_1b8._0_8_ == 0) {
      iVar6 = (int)*(long *)(local_1b8._0_8_ + 0x18);
      uVar18 = (ulong)iVar6;
      plVar17 = *(long **)(local_1b8._0_8_ + 8);
      if (uVar18 == 0x20) {
        if (plVar17 == (long *)0x0) {
          plVar16 = &gmlc::containers::
                     StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                     emptyValue;
        }
        else {
          plVar16 = plVar17 + (long)*(int *)(local_1b8._0_8_ + 0x14) + 1;
        }
        pIVar20 = (Input *)*plVar16;
        goto LAB_0020f8de;
      }
      pIVar20 = (Input *)(plVar17[*(int *)(local_1b8._0_8_ + 0x14)] + uVar18 * 0x130);
      plVar16 = plVar17 + *(int *)(local_1b8._0_8_ + 0x14);
LAB_0020f82f:
      local_1e8 = (Input **)(plVar17 + *(int *)(local_1b8._0_8_ + 0x14));
    }
    else {
      plVar17 = *(long **)(local_1b8._0_8_ + 8);
      pIVar20 = (Input *)*plVar17;
      iVar6 = (int)*(long *)(local_1b8._0_8_ + 0x18);
      uVar18 = 0;
      plVar16 = plVar17;
      if (iVar6 != 0x20) goto LAB_0020f82f;
LAB_0020f8de:
      if (plVar17 == (long *)0x0) {
        local_1e8 = (Input **)
                    &gmlc::containers::
                     StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                     emptyValue;
      }
      else {
        local_1e8 = (Input **)(plVar17 + (long)*(int *)(local_1b8._0_8_ + 0x14) + 1);
      }
      uVar18 = 0;
      iVar6 = 0;
    }
    while ((iVar9 = (int)uVar18, iVar9 != iVar6 || ((Input **)plVar16 != local_1e8))) {
      bVar5 = Input::isUpdated(pIVar20);
      if (bVar5) {
        Input::Input((Input *)local_160,pIVar20);
        if ((local_110 == HELICS_ANY) || (DVar1 = local_110, local_110 == HELICS_UNKNOWN)) {
          DVar1 = pIVar20->injectionType;
        }
        p_Var2 = (pIVar20->super_Interface)._vptr_Interface[4];
        if (DVar1 == HELICS_VECTOR) {
          iVar8 = (*p_Var2)(pIVar20);
          Input::getValue_impl<std::vector<double,std::allocator<double>>>
                    ((vector<double,_std::allocator<double>_> *)local_1d8,(Input *)local_160);
          fileops::JsonBuilder::addElement
                    ((JsonBuilder *)&local_190,(string *)CONCAT44(extraout_var_00,iVar8),
                     (vector<double,_std::allocator<double>_> *)local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            uVar18 = local_1c8._M_allocated_capacity - local_1d8._0_8_;
LAB_0020fa07:
            operator_delete((void *)local_1d8._0_8_,uVar18);
          }
        }
        else if (DVar1 == HELICS_DOUBLE) {
          iVar8 = (*p_Var2)(pIVar20);
          Input::getValue_impl<double>((Input *)local_160,local_1d8);
          fileops::JsonBuilder::addElement
                    ((JsonBuilder *)&local_190,(string *)CONCAT44(extraout_var,iVar8),
                     (double)local_1d8._0_8_);
        }
        else {
          iVar8 = (*p_Var2)(pIVar20);
          Input::getValue_impl<std::__cxx11::string>((string *)local_1d8,(Input *)local_160);
          fileops::JsonBuilder::addElement
                    ((JsonBuilder *)&local_190,(string *)CONCAT44(extraout_var_01,iVar8),
                     (string *)local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._0_8_ != &local_1c8) {
            uVar18 = local_1c8._M_allocated_capacity + 1;
            goto LAB_0020fa07;
          }
        }
        Input::~Input((Input *)local_160);
      }
      uVar18 = (ulong)(iVar9 + 1U);
      if (iVar9 < 0x1f) {
        pIVar20 = pIVar20 + 1;
      }
      else {
        plVar16 = plVar16 + (ulong)(iVar9 - 0x1fU >> 5) + 1;
        uVar18 = (ulong)(iVar9 + 1U & 0x1f);
        pIVar20 = (Input *)(*plVar16 + uVar18 * 0x130);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_1b8 + 8));
    fileops::JsonBuilder::generate_abi_cxx11_((string *)local_160,(JsonBuilder *)&local_190);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
    goto switchD_0020f0e4_caseD_8;
  case 0xc:
    iVar6 = bcmp(__s1,"publications",__n);
    if (iVar6 != 0) {
      return local_198;
    }
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock_shared((shared_handle *)&local_190,&this->publications);
    local_1b8._0_8_ = &local_1a8;
    local_1a8._M_allocated_capacity._0_2_ = 0x5b;
    local_1b8._8_8_ = (mutex_type *)0x1;
    if (((local_190.data)->dataStorage).csize == 0) {
      iVar6 = ((local_190.data)->dataStorage).bsize;
      uVar18 = (ulong)iVar6;
      local_1e8 = ((local_190.data)->dataStorage).dataptr;
      if (uVar18 == 0x20) {
        lVar12 = (long)((local_190.data)->dataStorage).dataSlotIndex;
        if (local_1e8 == (Input **)0x0) {
          ppIVar14 = (Input **)
                     &gmlc::containers::
                      StableBlockVector<helics::Publication,5u,std::allocator<helics::Publication>>
                      ::end()::emptyValue;
        }
        else {
          ppIVar14 = local_1e8 + lVar12 + 1;
        }
        pIVar20 = *ppIVar14;
        goto LAB_0020fc1f;
      }
      lVar12 = (long)((local_190.data)->dataStorage).dataSlotIndex;
      pIVar20 = (Input *)((long)&local_1e8[lVar12]->super_Interface + uVar18 * 200);
      ppIVar14 = local_1e8 + lVar12;
LAB_0020f877:
      local_1e8 = local_1e8 + lVar12;
    }
    else {
      local_1e8 = ((local_190.data)->dataStorage).dataptr;
      pIVar20 = *local_1e8;
      iVar6 = ((local_190.data)->dataStorage).bsize;
      uVar18 = 0;
      lVar12 = (long)((local_190.data)->dataStorage).dataSlotIndex;
      ppIVar14 = local_1e8;
      if (iVar6 != 0x20) goto LAB_0020f877;
LAB_0020fc1f:
      if (local_1e8 == (Input **)0x0) {
        local_1e8 = (Input **)
                    &gmlc::containers::
                     StableBlockVector<helics::Publication,5u,std::allocator<helics::Publication>>::
                     end()::emptyValue;
      }
      else {
        local_1e8 = local_1e8 + lVar12 + 1;
      }
      uVar18 = 0;
      iVar6 = 0;
    }
    if (((int)uVar18 != iVar6) || (ppIVar14 != local_1e8)) {
      do {
        psVar11 = Interface::getName_abi_cxx11_(&pIVar20->super_Interface);
        if (psVar11->_M_string_length != 0) {
          psVar11 = Interface::getName_abi_cxx11_(&pIVar20->super_Interface);
          local_1d8._0_8_ = &local_1c8;
          pcVar3 = (psVar11->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1d8,pcVar3,pcVar3 + psVar11->_M_string_length);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8)
          ;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump((string_t *)local_160,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_170,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_170);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                    (char *)local_160._0_8_,local_160._8_8_);
          if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
            operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._0_8_ != &local_1c8) {
            operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                    ',');
        }
        iVar9 = (int)uVar18;
        uVar18 = (ulong)(iVar9 + 1U);
        if (iVar9 < 0x1f) {
          pIVar20 = (Input *)&(pIVar20->sourceTypes).
                              super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ppIVar14 = ppIVar14 + (ulong)(iVar9 - 0x1fU >> 5) + 1;
          uVar18 = (ulong)(iVar9 + 1U & 0x1f);
          pIVar20 = (Input *)((long)&(*ppIVar14)->super_Interface + uVar18 * 200);
        }
      } while (((int)uVar18 != iVar6) || (ppIVar14 != local_1e8));
      if ((mutex_type *)0x1 < (ulong)local_1b8._8_8_) goto LAB_00210110;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,']');
LAB_0021012b:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != &local_1a8) {
      operator_delete((void *)local_1b8._0_8_,
                      CONCAT62(local_1a8._M_allocated_capacity._2_6_,
                               local_1a8._M_allocated_capacity._0_2_) + 1);
    }
    this_00 = &local_190.m_handle_lock;
    goto LAB_00210157;
  case 0xd:
    iVar6 = bcmp(__s1,"subscriptions",__n);
    if (iVar6 != 0) {
      return local_198;
    }
    bVar5 = (this->targetIDs).enabled;
    if (bVar5 == true) {
      ppVar15 = (pthread_rwlock_t *)&(this->targetIDs).m_mutex;
      std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&ppVar15->__data);
    }
    else {
      ppVar15 = (pthread_rwlock_t *)0x0;
    }
    local_1b8._0_8_ = &local_1a8;
    local_1a8._M_allocated_capacity._0_2_ = 0x5b;
    local_1b8._8_8_ = (mutex_type *)0x1;
    p_Var10 = (_Rb_tree_node_base *)
              (this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var19 = &(this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var19) {
      local_178 = ppVar15;
      do {
        local_1d8._0_8_ = &local_1c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,*(long *)(p_Var10 + 1),
                   (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::dump((string_t *)local_160,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_190,-1,' ',true,hex);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&local_190);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                  (char *)local_160._0_8_,local_160._8_8_);
        if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
          operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != &local_1c8) {
          operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,','
                 );
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var19);
      ppVar15 = local_178;
      if ((mutex_type *)0x1 < (ulong)local_1b8._8_8_) {
        ((char *)(local_1b8._0_8_ + -1))[local_1b8._8_8_] = ']';
        goto LAB_0020f592;
      }
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,']');
LAB_0020f592:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != &local_1a8) {
      operator_delete((void *)local_1b8._0_8_,
                      CONCAT62(local_1a8._M_allocated_capacity._2_6_,
                               local_1a8._M_allocated_capacity._0_2_) + 1);
    }
    if (bVar5 == false) {
      return local_198;
    }
    pthread_rwlock_unlock(ppVar15);
    return local_198;
  default:
    if (__n == 0x13) {
      iVar6 = bcmp(__s1,"updated_input_names",0x13);
      if (iVar6 != 0) {
        return local_198;
      }
      gmlc::libguarded::
      shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
      ::lock_shared(&local_190,&this->inputs);
      local_1b8._0_8_ = &local_1a8;
      local_1a8._M_allocated_capacity._0_2_ = 0x5b;
      local_1b8._8_8_ = (mutex_type *)0x1;
      if (((local_190.data)->dataStorage).csize == 0) {
        iVar6 = ((local_190.data)->dataStorage).bsize;
        uVar18 = (ulong)iVar6;
        local_1e8 = ((local_190.data)->dataStorage).dataptr;
        if (uVar18 == 0x20) {
          lVar12 = (long)((local_190.data)->dataStorage).dataSlotIndex;
          if (local_1e8 == (Input **)0x0) {
            ppIVar14 = (Input **)
                       &gmlc::containers::
                        StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                        emptyValue;
          }
          else {
            ppIVar14 = local_1e8 + lVar12 + 1;
          }
          pIVar20 = *ppIVar14;
          goto LAB_0020ff9f;
        }
        lVar12 = (long)((local_190.data)->dataStorage).dataSlotIndex;
        pIVar20 = local_1e8[lVar12] + uVar18;
        ppIVar14 = local_1e8 + lVar12;
LAB_0020f8c1:
        local_1e8 = local_1e8 + lVar12;
      }
      else {
        local_1e8 = ((local_190.data)->dataStorage).dataptr;
        pIVar20 = *local_1e8;
        iVar6 = ((local_190.data)->dataStorage).bsize;
        uVar18 = 0;
        lVar12 = (long)((local_190.data)->dataStorage).dataSlotIndex;
        ppIVar14 = local_1e8;
        if (iVar6 != 0x20) goto LAB_0020f8c1;
LAB_0020ff9f:
        if (local_1e8 == (Input **)0x0) {
          local_1e8 = (Input **)
                      &gmlc::containers::
                       StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                       emptyValue;
        }
        else {
          local_1e8 = local_1e8 + lVar12 + 1;
        }
        uVar18 = 0;
        iVar6 = 0;
      }
      if (((int)uVar18 == iVar6) && (ppIVar14 == local_1e8)) {
LAB_0021011c:
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,']'
                 );
        goto LAB_0021012b;
      }
      do {
        bVar5 = Input::isUpdated(pIVar20);
        if (bVar5) {
          iVar9 = (*(pIVar20->super_Interface)._vptr_Interface[4])(pIVar20);
          local_1d8._0_8_ = &local_1c8;
          lVar12 = *(long *)CONCAT44(extraout_var_05,iVar9);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1d8,lVar12,
                     ((long *)CONCAT44(extraout_var_05,iVar9))[1] + lVar12);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8)
          ;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump((string_t *)local_160,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_170,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_170);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                    (char *)local_160._0_8_,local_160._8_8_);
          if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
            operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._0_8_ != &local_1c8) {
            operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                    ',');
        }
        iVar9 = (int)uVar18;
        uVar18 = (ulong)(iVar9 + 1U);
        if (iVar9 < 0x1f) {
          pIVar20 = pIVar20 + 1;
        }
        else {
          ppIVar14 = ppIVar14 + (ulong)(iVar9 - 0x1fU >> 5) + 1;
          uVar18 = (ulong)(iVar9 + 1U & 0x1f);
          pIVar20 = *ppIVar14 + uVar18;
        }
      } while (((int)uVar18 != iVar6) || (ppIVar14 != local_1e8));
      if ((ulong)local_1b8._8_8_ < (mutex_type *)0x2) goto LAB_0021011c;
LAB_00210110:
      ((char *)(local_1b8._0_8_ + -1))[local_1b8._8_8_] = ']';
      goto LAB_0021012b;
    }
    if (__n != 0x15) {
      return __return_storage_ptr__;
    }
    iVar6 = bcmp(__s1,"updated_input_indices",0x15);
    if (iVar6 != 0) {
      return local_198;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,0,0,
               "[",1);
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock((shared_handle *)local_1d8,&this->inputs);
    if (*(size_type *)local_1d8._0_8_ == 0) {
      iVar6 = (int)*(long *)(local_1d8._0_8_ + 0x18);
      uVar18 = (ulong)iVar6;
      plVar16 = *(long **)(local_1d8._0_8_ + 8);
      if (uVar18 != 0x20) {
        plVar17 = plVar16 + *(int *)(local_1d8._0_8_ + 0x14);
        pIVar20 = (Input *)(*plVar17 + uVar18 * 0x130);
        goto LAB_0020f436;
      }
      if (plVar16 == (long *)0x0) {
        plVar17 = &gmlc::containers::
                   StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                   emptyValue;
      }
      else {
        plVar17 = plVar16 + (long)*(int *)(local_1d8._0_8_ + 0x14) + 1;
      }
      pIVar20 = (Input *)*plVar17;
LAB_0020f648:
      if (plVar16 == (long *)0x0) {
        local_1e8 = (Input **)
                    &gmlc::containers::
                     StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                     emptyValue;
      }
      else {
        local_1e8 = (Input **)(plVar16 + (long)*(int *)(local_1d8._0_8_ + 0x14) + 1);
      }
      uVar18 = 0;
      iVar6 = 0;
    }
    else {
      plVar16 = *(long **)(local_1d8._0_8_ + 8);
      pIVar20 = (Input *)*plVar16;
      iVar6 = (int)*(long *)(local_1d8._0_8_ + 0x18);
      uVar18 = 0;
      plVar17 = plVar16;
      if (iVar6 == 0x20) goto LAB_0020f648;
LAB_0020f436:
      local_1e8 = (Input **)(plVar16 + *(int *)(local_1d8._0_8_ + 0x14));
    }
    if (((int)uVar18 != iVar6) || ((Input **)plVar17 != local_1e8)) {
      __val = 0;
      do {
        bVar5 = Input::isUpdated(pIVar20);
        if (bVar5) {
          __len = 1;
          if (9 < __val) {
            uVar13 = (ulong)__val;
            uVar4 = 4;
            do {
              __len = uVar4;
              uVar7 = (uint)uVar13;
              if (uVar7 < 100) {
                __len = __len - 2;
                goto LAB_0020f6d8;
              }
              if (uVar7 < 1000) {
                __len = __len - 1;
                goto LAB_0020f6d8;
              }
              if (uVar7 < 10000) goto LAB_0020f6d8;
              uVar13 = uVar13 / 10000;
              uVar4 = __len + 4;
            } while (99999 < uVar7);
            __len = __len + 1;
          }
LAB_0020f6d8:
          local_160._0_8_ = local_160 + 0x10;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_160,(ulong)__len,'-');
          CLI::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_160._0_8_,__len,__val);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                    (char *)local_160._0_8_,local_160._8_8_);
          if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
            operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                    ',');
        }
        iVar9 = (int)uVar18;
        uVar18 = (ulong)(iVar9 + 1U);
        if (iVar9 < 0x1f) {
          pIVar20 = pIVar20 + 1;
        }
        else {
          plVar17 = plVar17 + (ulong)(iVar9 - 0x1fU >> 5) + 1;
          uVar18 = (ulong)(iVar9 + 1U & 0x1f);
          pIVar20 = (Input *)(*plVar17 + uVar18 * 0x130);
        }
        __val = __val + 1;
      } while (((int)uVar18 != iVar6) || ((Input **)plVar17 != local_1e8));
    }
    psVar11 = local_198;
    if (((_Alloc_hider *)&local_198->_M_dataplus)->_M_p[local_198->_M_string_length - 1] == ',') {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar11,']');
    this_00 = (unique_lock<std::mutex> *)(local_1d8 + 8);
LAB_00210157:
    std::unique_lock<std::mutex>::~unique_lock(this_00);
    goto switchD_0020f0e4_caseD_8;
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
  if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  fileops::JsonBuilder::~JsonBuilder((JsonBuilder *)&local_190);
switchD_0020f0e4_caseD_8:
  return local_198;
}

Assistant:

std::string ValueFederateManager::localQuery(std::string_view queryStr) const
{
    std::string ret;
    if (queryStr == "inputs") {
        ret = generateStringVector_if(
            inputs.lock_shared(),
            [](const auto& info) { return info.getName(); },
            [](const auto& info) { return (!info.getName().empty()); });
    } else if (queryStr == "publications") {
        ret = generateStringVector_if(
            publications.lock_shared(),
            [](const auto& info) { return info.getName(); },
            [](const auto& info) { return (!info.getName().empty()); });
    } else if (queryStr == "subscriptions") {
        ret = generateStringVector(targetIDs.lock_shared(),
                                   [](const auto& target) { return target.first; });
    } else if (queryStr == "updated_input_indices") {
        ret = "[";
        auto hand = inputs.lock();
        int ii = 0;
        for (const auto& inp : *hand) {
            if (inp.isUpdated()) {
                ret.append(std::to_string(ii));
                ret.push_back(',');
            }
            ++ii;
        }
        if (ret.back() == ',') {
            ret.pop_back();
        }
        ret.push_back(']');
    } else if (queryStr == "updated_input_names") {
        ret = generateStringVector_if(
            inputs.lock_shared(),
            [](const auto& inp) { return inp.getDisplayName(); },
            [](const auto& inp) { return (inp.isUpdated()); });
    } else if (queryStr == "updates") {
        fileops::JsonBuilder JB;
        for (const auto& inp : inputs.lock_shared()) {
            if (inp.isUpdated()) {
                auto inpTemp = inp;
                auto iType = inpTemp.getHelicsType();
                if (iType == DataType::HELICS_ANY || iType == DataType::HELICS_UNKNOWN) {
                    iType = inp.getHelicsInjectionType();
                }
                if (iType == DataType::HELICS_DOUBLE) {
                    JB.addElement(inp.getDisplayName(), inpTemp.getValue<double>());
                } else if (iType == DataType::HELICS_VECTOR) {
                    JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::vector<double>>());
                } else {
                    JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::string>());
                }
            }
        }
        ret = JB.generate();
    } else if (queryStr == "values") {
        fileops::JsonBuilder JB;
        for (const auto& inp : inputs.lock_shared()) {
            auto inpTemp = inp;
            inpTemp.checkUpdate(true);
            auto iType = inpTemp.getHelicsType();
            if (iType == DataType::HELICS_ANY || iType == DataType::HELICS_UNKNOWN) {
                iType = inp.getHelicsInjectionType();
            }
            if (iType == DataType::HELICS_DOUBLE) {
                JB.addElement(inp.getDisplayName(), inpTemp.getValue<double>());
            } else if (iType == DataType::HELICS_VECTOR) {
                JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::vector<double>>());
            } else {
                JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::string>());
            }
        }
        ret = JB.generate();
    }
    return ret;
}